

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

Preface * __thiscall ASDCP::MXF::Preface::InitFromTLVSet(Preface *this,TLVReader *TLVSet)

{
  bool bVar1;
  int iVar2;
  MDDEntry *pMVar3;
  MDDEntry *pMVar4;
  MDDEntry *in_RDX;
  TLVReader local_4b0;
  TLVReader local_448;
  TLVReader local_3e0;
  TLVReader local_378;
  TLVReader local_310;
  TLVReader local_2a8;
  TLVReader local_240;
  TLVReader local_1d8;
  TLVReader local_170;
  TLVReader local_108;
  TLVReader local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVReader *TLVSet_local;
  Preface *this_local;
  Result_t *result;
  
  local_21 = 0;
  local_20 = in_RDX;
  TLVSet_local = TLVSet;
  this_local = this;
  InterchangeObject::InitFromTLVSet(&this->super_InterchangeObject,TLVSet);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Preface_LastModifiedDate);
    TLVReader::ReadObject(&local_a0,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,MDD_Preface_Version);
    TLVReader::ReadUi16(&local_108,pMVar4,(ui16_t *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_108);
    Kumu::Result_t::~Result_t((Result_t *)&local_108);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Preface_ObjectModelVersion);
    optional_property<unsigned_int>::get
              ((optional_property<unsigned_int> *)
               ((long)&TLVSet[2].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left +
               4));
    TLVReader::ReadUi32(&local_170,pMVar4,(ui32_t *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_170);
    Kumu::Result_t::~Result_t((Result_t *)&local_170);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Preface_PrimaryPackage);
    optional_property<Kumu::UUID>::get
              ((optional_property<Kumu::UUID> *)
               &TLVSet[2].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    TLVReader::ReadObject(&local_1d8,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_1d8);
    Kumu::Result_t::~Result_t((Result_t *)&local_1d8);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Preface_Identifications);
    TLVReader::ReadObject(&local_240,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_240);
    Kumu::Result_t::~Result_t((Result_t *)&local_240);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Preface_ContentStorage);
    TLVReader::ReadObject(&local_2a8,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_2a8);
    Kumu::Result_t::~Result_t((Result_t *)&local_2a8);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Core_OperationalPattern);
    TLVReader::ReadObject(&local_310,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_310);
    Kumu::Result_t::~Result_t((Result_t *)&local_310);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Core_EssenceContainers);
    TLVReader::ReadObject(&local_378,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_378);
    Kumu::Result_t::~Result_t((Result_t *)&local_378);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,MDD_Preface_DMSchemes);
    TLVReader::ReadObject(&local_3e0,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_3e0);
    Kumu::Result_t::~Result_t((Result_t *)&local_3e0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Preface_ApplicationSchemes);
    optional_property<ASDCP::MXF::Batch<ASDCP::UL>_>::get
              ((optional_property<ASDCP::MXF::Batch<ASDCP::UL>_> *)
               &TLVSet[6].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    TLVReader::ReadObject(&local_448,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_448);
    Kumu::Result_t::~Result_t((Result_t *)&local_448);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<ASDCP::MXF::Batch<ASDCP::UL>_>::set_has_value
              ((optional_property<ASDCP::MXF::Batch<ASDCP::UL>_> *)
               &TLVSet[6].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,bVar1)
    ;
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar2) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Preface_ConformsToSpecifications);
    optional_property<ASDCP::MXF::Batch<ASDCP::UL>_>::get
              ((optional_property<ASDCP::MXF::Batch<ASDCP::UL>_> *)
               &TLVSet[7].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    TLVReader::ReadObject(&local_4b0,local_20,(IArchive *)pMVar4);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_4b0);
    Kumu::Result_t::~Result_t((Result_t *)&local_4b0);
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<ASDCP::MXF::Batch<ASDCP::UL>_>::set_has_value
              ((optional_property<ASDCP::MXF::Batch<ASDCP::UL>_> *)
               &TLVSet[7].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,bVar1)
    ;
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Preface::InitFromTLVSet(TLVReader& TLVSet)
{
  Result_t result = InterchangeObject::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Preface, LastModifiedDate));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi16(OBJ_READ_ARGS(Preface, Version));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS_OPT(Preface, ObjectModelVersion));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(Preface, PrimaryPackage));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Preface, Identifications));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Preface, ContentStorage));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Preface, OperationalPattern));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Preface, EssenceContainers));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Preface, DMSchemes));
  if ( ASDCP_SUCCESS(result) ) 
    {
      result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(Preface, ApplicationSchemes));
      ApplicationSchemes.set_has_value( result == RESULT_OK);
    }
  if ( ASDCP_SUCCESS(result) )
    {
      result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(Preface, ConformsToSpecifications));
      ConformsToSpecifications.set_has_value( result == RESULT_OK);
    }
  return result;
}